

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::js::(anonymous_namespace)::JSIdent_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,GeneratorOptions *options,
          FieldDescriptor *field,bool is_upper_camel,bool is_map,bool drop_list)

{
  bool bVar1;
  Type TVar2;
  Descriptor *pDVar3;
  string *psVar4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_f0;
  byte local_d1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_d0;
  string local_b8;
  byte local_91;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_90;
  byte local_71;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_70;
  string local_58;
  undefined1 local_24;
  byte local_23;
  byte local_22;
  byte local_21;
  bool drop_list_local;
  bool is_map_local;
  GeneratorOptions *pGStack_20;
  bool is_upper_camel_local;
  FieldDescriptor *field_local;
  GeneratorOptions *options_local;
  string *result;
  
  local_21 = (byte)field & 1;
  local_24 = 0;
  local_23 = is_map;
  local_22 = is_upper_camel;
  pGStack_20 = options;
  field_local = (FieldDescriptor *)this;
  options_local = (GeneratorOptions *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  TVar2 = FieldDescriptor::type((FieldDescriptor *)pGStack_20);
  if (TVar2 == TYPE_GROUP) {
    local_71 = 0;
    local_91 = 0;
    if ((local_21 & 1) == 0) {
      pDVar3 = FieldDescriptor::message_type((FieldDescriptor *)pGStack_20);
      psVar4 = Descriptor::name_abi_cxx11_(pDVar3);
      anon_unknown_0::ParseUpperCamel(&local_90,psVar4);
      local_91 = 1;
      anon_unknown_0::ToLowerCamel(&local_58,&local_90);
    }
    else {
      pDVar3 = FieldDescriptor::message_type((FieldDescriptor *)pGStack_20);
      psVar4 = Descriptor::name_abi_cxx11_(pDVar3);
      anon_unknown_0::ParseUpperCamel(&local_70,psVar4);
      local_71 = 1;
      anon_unknown_0::ToUpperCamel(&local_58,&local_70);
    }
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    if ((local_91 & 1) != 0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_90);
    }
    if ((local_71 & 1) != 0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_70);
    }
  }
  else {
    local_d1 = 0;
    bVar1 = (local_21 & 1) == 0;
    if (bVar1) {
      psVar4 = FieldDescriptor::name_abi_cxx11_((FieldDescriptor *)pGStack_20);
      anon_unknown_0::ParseLowerUnderscore(&local_f0,psVar4);
      anon_unknown_0::ToLowerCamel(&local_b8,&local_f0);
    }
    else {
      psVar4 = FieldDescriptor::name_abi_cxx11_((FieldDescriptor *)pGStack_20);
      anon_unknown_0::ParseLowerUnderscore(&local_d0,psVar4);
      local_d1 = 1;
      anon_unknown_0::ToUpperCamel(&local_b8,&local_d0);
    }
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_b8);
    if (bVar1) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_f0);
    }
    if ((local_d1 & 1) != 0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_d0);
    }
  }
  if (((local_22 & 1) != 0) ||
     (bVar1 = anon_unknown_0::IsMap((GeneratorOptions *)field_local,(FieldDescriptor *)pGStack_20),
     bVar1)) {
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"Map");
  }
  else if (((local_23 & 1) == 0) &&
          (bVar1 = FieldDescriptor::is_repeated((FieldDescriptor *)pGStack_20), bVar1)) {
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"List");
  }
  return __return_storage_ptr__;
}

Assistant:

string JSIdent(const GeneratorOptions& options, const FieldDescriptor* field,
               bool is_upper_camel, bool is_map, bool drop_list) {
  string result;
  if (field->type() == FieldDescriptor::TYPE_GROUP) {
    result = is_upper_camel ?
        ToUpperCamel(ParseUpperCamel(field->message_type()->name())) :
        ToLowerCamel(ParseUpperCamel(field->message_type()->name()));
  } else {
    result = is_upper_camel ?
        ToUpperCamel(ParseLowerUnderscore(field->name())) :
        ToLowerCamel(ParseLowerUnderscore(field->name()));
  }
  if (is_map || IsMap(options, field)) {
    // JSPB-style or proto3-style map.
    result += "Map";
  } else if (!drop_list && field->is_repeated()) {
    // Repeated field.
    result += "List";
  }
  return result;
}